

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validator.cc
# Opt level: O2

Result __thiscall wabt::anon_unknown_4::Validator::OnConstExpr(Validator *this,ConstExpr *expr)

{
  Result RVar1;
  
  RVar1 = SharedValidator::OnConst
                    (&this->validator_,&(expr->super_ExprMixin<(wabt::ExprType)17>).super_Expr.loc,
                     (expr->const_).type_);
  (this->result_).enum_ = (uint)(RVar1.enum_ == Error || (this->result_).enum_ == Error);
  return (Result)Ok;
}

Assistant:

Result Validator::OnConstExpr(ConstExpr* expr) {
  result_ |= validator_.OnConst(expr->loc, expr->const_.type());
  return Result::Ok;
}